

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Check_Browser.cxx
# Opt level: O0

int __thiscall Fl_Check_Browser::lineno(Fl_Check_Browser *this,cb_item *p0)

{
  int local_2c;
  cb_item *pcStack_28;
  int i;
  cb_item *p;
  cb_item *p0_local;
  Fl_Check_Browser *this_local;
  
  pcStack_28 = this->first;
  if (pcStack_28 != (cb_item *)0x0) {
    local_2c = 1;
    for (; pcStack_28 != (cb_item *)0x0; pcStack_28 = pcStack_28->next) {
      if (pcStack_28 == p0) {
        return local_2c;
      }
      local_2c = local_2c + 1;
    }
  }
  return 0;
}

Assistant:

int Fl_Check_Browser::lineno(cb_item *p0) const {
	cb_item *p = first;

	if (p == 0) {
		return 0;
	}

	int i = 1;
	while (p) {
		if (p == p0) {
			return i;
		}
		i++;
		p = p->next;
	}

	return 0;
}